

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

bool __thiscall bloaty::pe::PeFile::Initialize(PeFile *this)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  bool bVar4;
  size_type sVar5;
  const_pointer pvVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  PeFile *this_00;
  uint64_t uVar9;
  ulong uVar10;
  uint64_t in_RDI;
  string_view sVar11;
  uint64_t sections_size;
  uint32_t sections_offset;
  uint64_t pe_end;
  PE_TYPE Magic;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  undefined6 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffee;
  bool local_1;
  
  uVar9 = in_RDI;
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
  if (sVar5 < 0x40) {
    local_1 = false;
  }
  else {
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
    memcpy((void *)(in_RDI + 0x18),pvVar6,0x40);
    if (*(short *)(in_RDI + 0x18) == 0x5a4d) {
      uVar7 = CheckedAdd(uVar9,CONCAT26(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8));
      uVar8 = CheckedAdd(uVar9,CONCAT26(in_stack_ffffffffffffffee,in_stack_ffffffffffffffe8));
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
      if (sVar5 < uVar8) {
        local_1 = false;
      }
      else {
        pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
        uVar10 = (ulong)*(uint *)(in_RDI + 0x54);
        *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(pvVar6 + uVar10);
        *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(pvVar6 + uVar10 + 8);
        *(undefined8 *)(in_RDI + 0x68) = *(undefined8 *)(pvVar6 + uVar10 + 0x10);
        uVar8 = in_RDI + 0x58;
        this_00 = (PeFile *)(in_RDI + 0x5c);
        std::begin<char_const,4ul>((char (*) [4])&PE_Magic);
        bVar4 = std::equal<char*,char_const*>
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(char *)0x1e587a);
        if (bVar4) {
          pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                             ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
          sVar1 = *(short *)(pvVar6 + uVar7);
          if ((sVar1 == 0x10b) || (sVar1 == 0x20b)) {
            *(bool *)(in_RDI + 1) = sVar1 == 0x20b;
            *(uint *)(in_RDI + 0x90) = (uint)*(ushort *)(in_RDI + 0x5e);
            iVar3 = *(int *)(in_RDI + 0x54);
            uVar2 = *(ushort *)(in_RDI + 0x6c);
            uVar9 = CheckedMul(uVar9,CONCAT26(sVar1,in_stack_ffffffffffffffe8));
            uVar10 = (iVar3 + 0x18 + (uint)uVar2) + uVar9;
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8));
            if (sVar5 < uVar10) {
              local_1 = false;
            }
            else {
              sVar11 = GetRegion(this_00,uVar8,uVar10);
              local_40 = sVar11._M_len;
              *(size_t *)(in_RDI + 0x70) = local_40;
              local_38 = sVar11._M_str;
              *(char **)(in_RDI + 0x78) = local_38;
              sVar11 = GetRegion(this_00,uVar8,uVar10);
              local_50 = sVar11._M_len;
              *(size_t *)(in_RDI + 0x80) = local_50;
              local_48 = sVar11._M_str;
              *(char **)(in_RDI + 0x88) = local_48;
              local_1 = true;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool PeFile::Initialize() {
  if (data_.size() < sizeof(dos_header_)) {
    return false;
  }

  memcpy(&dos_header_, data_.data(), sizeof(dos_header_));

  if (dos_header_.Magic != dos_magic) {
    // Not a PE file.
    return false;
  }

  PE_TYPE Magic;
  auto pe_end =
      CheckedAdd(dos_header_.AddressOfNewExeHeader, sizeof(pe_header_));
  if (CheckedAdd(pe_end, sizeof(Magic)) > data_.size()) {
    // Cannot fit the headers / magic from optional header
    return false;
  }

  memcpy(&pe_header_, data_.data() + dos_header_.AddressOfNewExeHeader,
         sizeof(pe_header_));

  if (!std::equal(pe_header_.signature, pe_header_.signature + sizeof(PE_Magic),
                  std::begin(PE_Magic))) {
    // Not a PE file.
    return false;
  }

  memcpy(&Magic, data_.data() + pe_end, sizeof(Magic));

  if (Magic != PE_TYPE::PE32 && Magic != PE_TYPE::PE32_PLUS) {
    // Unknown PE magic
    return false;
  }

  is_64bit_ = Magic == PE_TYPE::PE32_PLUS;

  section_count_ = pe_header_.NumberOfSections;

  // TODO(mj): Figure out if we should trust SizeOfOptionalHeader here
  const uint32_t sections_offset = dos_header_.AddressOfNewExeHeader +
                                   sizeof(pe_header_) +
                                   pe_header_.SizeOfOptionalHeader;

  auto sections_size = CheckedMul(section_count_, sizeof(pe_section));
  if ((sections_offset + sections_size) > data_.size()) {
    // Cannot fit the headers
    return false;
  }

  pe_headers_ = GetRegion(0, sections_offset);
  section_headers_ = GetRegion(sections_offset, sections_size);

  return true;
}